

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O3

int __thiscall
YAML::RegEx::MatchUnchecked<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  Stream *pSVar1;
  _Elt_pointer pcVar2;
  RegEx *this_00;
  pointer pRVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  _Elt_pointer pcVar7;
  uint uVar8;
  char *pcVar9;
  pointer pRVar10;
  ulong uVar11;
  RegEx *param;
  long lVar12;
  bool bVar13;
  StreamCharSource local_40;
  
  uVar5 = 0xffffffff;
  uVar8 = uVar5;
  switch(this->m_op) {
  case REGEX_EMPTY:
    pSVar1 = source->m_stream;
    pcVar2 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar2 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)pcVar7 < 0) {
      uVar11 = (long)pcVar7 >> 9;
LAB_00713cb8:
      pcVar9 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar11] + (long)(pcVar7 + uVar11 * -0x200);
    }
    else {
      if ((_Elt_pointer)0x1ff < pcVar7) {
        uVar11 = (ulong)pcVar7 >> 9;
        goto LAB_00713cb8;
      }
      pcVar9 = pcVar2 + source->m_offset;
    }
    uVar8 = -(uint)(*pcVar9 != '\x04');
    break;
  case REGEX_MATCH:
    pSVar1 = source->m_stream;
    pcVar2 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar2 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)pcVar7 < 0) {
      uVar11 = (long)pcVar7 >> 9;
LAB_00713cda:
      pcVar9 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar11] + (long)(pcVar7 + uVar11 * -0x200);
    }
    else {
      if ((_Elt_pointer)0x1ff < pcVar7) {
        uVar11 = (ulong)pcVar7 >> 9;
        goto LAB_00713cda;
      }
      pcVar9 = pcVar2 + source->m_offset;
    }
    bVar13 = *pcVar9 == this->m_a;
    goto LAB_00713cf2;
  case REGEX_RANGE:
    pSVar1 = source->m_stream;
    pcVar2 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar2 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)pcVar7 < 0) {
      uVar11 = (long)pcVar7 >> 9;
LAB_00713c8c:
      pcVar9 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar11];
      if (pcVar9[(uint)pcVar7 & 0x1ff] < this->m_a) {
        return 0xffffffff;
      }
      cVar4 = pcVar9[(long)(pcVar7 + uVar11 * -0x200)];
    }
    else {
      if ((_Elt_pointer)0x1ff < pcVar7) {
        uVar11 = (ulong)pcVar7 >> 9;
        goto LAB_00713c8c;
      }
      cVar4 = pcVar2[source->m_offset];
      if (cVar4 < this->m_a) {
        return 0xffffffff;
      }
    }
    bVar13 = cVar4 <= this->m_z;
LAB_00713cf2:
    uVar8 = (uint)bVar13 * 2 - 1;
    break;
  case REGEX_OR:
    pRVar10 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    pRVar3 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((uVar8 = uVar5, pRVar10 != pRVar3 &&
           (uVar8 = MatchUnchecked<YAML::StreamCharSource>(pRVar10,source), (int)uVar8 < 0))) {
      pRVar10 = pRVar10 + 1;
    }
    break;
  case REGEX_AND:
    pRVar10 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar10) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        uVar8 = MatchUnchecked<YAML::StreamCharSource>
                          ((RegEx *)((long)&pRVar10->m_op + lVar12),source);
        if (uVar8 == 0xffffffff) {
          return 0xffffffff;
        }
        if (uVar11 == 0) {
          uVar5 = uVar8;
        }
        uVar11 = uVar11 + 1;
        pRVar10 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x20;
        uVar8 = uVar5;
      } while (uVar11 < (ulong)((long)(this->m_params).
                                      super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pRVar10 >> 5
                               ));
    }
    break;
  case REGEX_NOT:
    this_00 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (this_00 !=
        (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar5 = MatchUnchecked<YAML::StreamCharSource>(this_00,source);
      uVar8 = (int)~uVar5 >> 0x1f | 1;
    }
    break;
  case REGEX_SEQ:
    pRVar10 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    pRVar3 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pRVar10 == pRVar3) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        local_40.m_stream = source->m_stream;
        local_40.m_offset = source->m_offset + (long)(int)uVar8;
        if ((int)(uVar8 + (int)source->m_offset) < 0) {
          local_40.m_offset = 0;
        }
        iVar6 = Match<YAML::StreamCharSource>(pRVar10,&local_40);
        if (iVar6 == -1) {
          return 0xffffffff;
        }
        uVar8 = iVar6 + uVar8;
        pRVar10 = pRVar10 + 1;
      } while (pRVar10 != pRVar3);
    }
  }
  return uVar8;
}

Assistant:

inline int RegEx::MatchUnchecked(const Source& source) const {
  switch (m_op) {
    case REGEX_EMPTY:
      return MatchOpEmpty(source);
    case REGEX_MATCH:
      return MatchOpMatch(source);
    case REGEX_RANGE:
      return MatchOpRange(source);
    case REGEX_OR:
      return MatchOpOr(source);
    case REGEX_AND:
      return MatchOpAnd(source);
    case REGEX_NOT:
      return MatchOpNot(source);
    case REGEX_SEQ:
      return MatchOpSeq(source);
  }

  return -1;
}